

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImPool<ImGuiTable>::~ImPool(ImPool<ImGuiTable> *this)

{
  ImPool<ImGuiTable> *in_RDI;
  
  Clear(in_RDI);
  ImGuiStorage::~ImGuiStorage((ImGuiStorage *)0x152668);
  ImVector<ImGuiTable>::~ImVector(&in_RDI->Buf);
  return;
}

Assistant:

~ImPool()   { Clear(); }